

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_free(tree *t)

{
  int local_14;
  wchar_t i;
  tree *t_local;
  
  if (t != (tree *)0x0) {
    archive_string_free(&t->path);
    free(t->dirent);
    free(t->sparse_list);
    for (local_14 = 0; local_14 < t->max_filesystem_id; local_14 = local_14 + 1) {
      free(t->filesystem_table[local_14].allocation_ptr);
    }
    free(t->filesystem_table);
    free(t);
  }
  return;
}

Assistant:

static void
tree_free(struct tree *t)
{
	int i;

	if (t == NULL)
		return;
	archive_string_free(&t->path);
#if defined(HAVE_READDIR_R)
	free(t->dirent);
#endif
	free(t->sparse_list);
	for (i = 0; i < t->max_filesystem_id; i++)
		free(t->filesystem_table[i].allocation_ptr);
	free(t->filesystem_table);
	free(t);
}